

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::treeFind
          (const_iterator *this,unsigned_long left,unsigned_long right)

{
  size_type sVar1;
  pointer pEVar2;
  interval<unsigned_long> *piVar3;
  int iVar4;
  uint uVar5;
  ulong *puVar6;
  uint32_t uVar7;
  long lVar8;
  BranchNode<unsigned_long,_8U,_false> *self;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint local_3c;
  NodeRef local_38;
  
  uVar7 = this->map->rootSize;
  if (uVar7 == 0) {
LAB_0028ea1e:
    uVar7 = 0;
  }
  else {
    piVar3 = (this->map->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
             .first + 4;
    iVar4 = 1;
    do {
      if (left <= piVar3->left) {
        if (iVar4 == 1) goto LAB_0028ea1e;
        uVar7 = -iVar4;
        goto LAB_0028ea26;
      }
      iVar10 = uVar7 + iVar4;
      iVar4 = iVar4 + -1;
      piVar3 = piVar3 + 1;
    } while (iVar10 != 2);
    uVar7 = uVar7 - 1;
  }
LAB_0028ea26:
  setRoot(this,uVar7);
  sVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar1 != 0) &&
     (pEVar2 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
     , pEVar2->offset < pEVar2->size)) {
    iVar4 = (int)sVar1;
    uVar5 = iVar4 - 1;
    local_38.pip.value =
         *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
          ((long)pEVar2[uVar5].node + (ulong)pEVar2[uVar5].offset * 8);
    iVar4 = this->map->height - iVar4;
    if (iVar4 != 0) {
      do {
        uVar9 = (ulong)local_38.pip.value & 0xffffffffffffffc0;
        uVar5 = SUB84(local_38.pip.value,0) & 0x3f;
        iVar10 = uVar5 + 1;
        puVar6 = (ulong *)(uVar9 + 0x40);
        lVar8 = 0;
        do {
          if (left <= *puVar6) {
            iVar10 = (int)lVar8;
            break;
          }
          lVar8 = lVar8 + 1;
          puVar6 = puVar6 + 2;
        } while ((ulong)uVar5 + 1 != lVar8);
        local_3c = iVar10 - 1;
        if (iVar10 == 0) {
          local_3c = 0;
        }
        uVar11 = (ulong)local_3c;
        SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
        emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                  ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&local_38,
                   &local_3c);
        local_38.pip.value = *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)(uVar9 + uVar11 * 8);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    puVar6 = (ulong *)((ulong)local_38.pip.value & 0xffffffffffffffc0);
    uVar5 = SUB84(local_38.pip.value,0) & 0x3f;
    local_3c = uVar5 + 1;
    lVar8 = 0;
    do {
      if (left <= *puVar6) {
        local_3c = (uint)lVar8;
        break;
      }
      lVar8 = lVar8 + 1;
      puVar6 = puVar6 + 2;
    } while ((ulong)uVar5 + 1 != lVar8);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
    emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&local_38,
               &local_3c);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::const_iterator::treeFind(TKey left, TKey right) {
    using namespace IntervalMapDetails;
    SLANG_ASSERT(!isFlat());

    interval<TKey> ival{left, right};
    uint32_t offset = map->rootBranch.find(map->rootSize, ival);
    if (offset)
        offset--;
    setRoot(offset);

    if (valid()) {
        auto child = path.childAt(path.height());
        for (uint32_t i = map->height - path.height() - 1; i > 0; i--) {
            offset = child.template get<Branch>().find(child.size(), ival);
            if (offset)
                offset--;
            path.push(child, offset);
            child = child.childAt(offset);
        }

        path.push(child, child.template get<Leaf>().find(child.size(), ival));
    }
}